

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSat.c
# Opt level: O0

void Ssc_ManCnfAddToFrontier(Ssc_Man_t *p,int Id,Vec_Int_t *vFront)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  Vec_Int_t *vFront_local;
  int Id_local;
  Ssc_Man_t *p_local;
  
  if (Id < 1) {
    __assert_fail("Id > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                  ,199,"void Ssc_ManCnfAddToFrontier(Ssc_Man_t *, int, Vec_Int_t *)");
  }
  iVar1 = Ssc_ObjSatVar(p,Id);
  if (iVar1 == 0) {
    pObj_00 = Gia_ManObj(p->pFraig,Id);
    iVar1 = p->nSatVars;
    p->nSatVars = iVar1 + 1;
    Ssc_ObjSetSatVar(p,Id,iVar1);
    sat_solver_setnvars(p->pSat,p->nSatVars + 100);
    iVar1 = Gia_ObjIsAnd(pObj_00);
    if (iVar1 != 0) {
      Vec_IntPush(vFront,Id);
    }
  }
  return;
}

Assistant:

static void Ssc_ManCnfAddToFrontier( Ssc_Man_t * p, int Id, Vec_Int_t * vFront )
{
    Gia_Obj_t * pObj;
    assert( Id > 0 );
    if ( Ssc_ObjSatVar(p, Id) )
        return;
    pObj = Gia_ManObj( p->pFraig, Id );
    Ssc_ObjSetSatVar( p, Id, p->nSatVars++ );
    sat_solver_setnvars( p->pSat, p->nSatVars + 100 );
    if ( Gia_ObjIsAnd(pObj) )
        Vec_IntPush( vFront, Id );
}